

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal-c.cpp
# Opt level: O3

bool duckdb::CastDecimalCInternal<duckdb_string>
               (duckdb_result *source,duckdb_string *result,idx_t col,idx_t row)

{
  PhysicalType PVar1;
  duckdb_string *pdVar2;
  uint8_t width;
  uint8_t scale;
  pointer pQVar3;
  reference type;
  char *__dest;
  InternalException *this;
  char *__src;
  ulong __n;
  Vector *in_R9;
  int64_t *piVar4;
  uint uVar5;
  hugeint_t input;
  Vector result_vec;
  anon_union_16_2_67f50693_for_value local_e8;
  duckdb_string *local_d8;
  string local_d0;
  LogicalType local_b0;
  Vector local_98;
  
  local_d8 = result;
  pQVar3 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)source->internal_data);
  type = vector<duckdb::LogicalType,_true>::operator[](&(pQVar3->super_BaseQueryResult).types,col);
  width = DecimalType::GetWidth(type);
  scale = DecimalType::GetScale(type);
  LogicalType::LogicalType(&local_b0,VARCHAR);
  Vector::Vector(&local_98,&local_b0,false,false,0x800);
  LogicalType::~LogicalType(&local_b0);
  piVar4 = (int64_t *)(row * 0x10 + (long)source->deprecated_columns[col].deprecated_data);
  PVar1 = type->physical_type_;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      local_e8.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringCastFromDecimal::Operation<short>((int16_t)*piVar4,width,scale,&local_98);
    }
    else {
      if (PVar1 != INT32) {
LAB_017ee022:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Unimplemented internal type for decimal","");
        InternalException::InternalException(this,&local_d0);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_e8.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringCastFromDecimal::Operation<int>((int32_t)*piVar4,width,scale,&local_98);
    }
  }
  else if (PVar1 == INT64) {
    local_e8.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringCastFromDecimal::Operation<long>(*piVar4,width,scale,&local_98);
  }
  else {
    if (PVar1 != INT128) goto LAB_017ee022;
    input.upper._0_1_ = width;
    input.lower = piVar4[1];
    input.upper._1_7_ = 0;
    local_e8.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringCastFromDecimal::Operation<duckdb::hugeint_t>
                   ((StringCastFromDecimal *)*piVar4,input,scale,(uint8_t)&local_98,in_R9);
  }
  __src = local_e8.pointer.ptr;
  uVar5 = local_e8.pointer.length;
  __n = local_e8._0_8_ & 0xffffffff;
  __dest = (char *)duckdb_malloc(__n + 1);
  pdVar2 = local_d8;
  local_d8->data = __dest;
  if (uVar5 < 0xd) {
    __src = local_e8.pointer.prefix;
  }
  switchD_015de399::default(__dest,__src,__n);
  pdVar2->data[__n] = '\0';
  pdVar2->size = __n;
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

bool CastDecimalCInternal(duckdb_result *source, duckdb_string &result, idx_t col, idx_t row) {
	auto result_data = (duckdb::DuckDBResultData *)source->internal_data;
	auto &query_result = result_data->result;
	auto &source_type = query_result->types[col];
	auto width = duckdb::DecimalType::GetWidth(source_type);
	auto scale = duckdb::DecimalType::GetScale(source_type);
	duckdb::Vector result_vec(duckdb::LogicalType::VARCHAR, false, false);
	duckdb::string_t result_string;
	void *source_address = UnsafeFetchPtr<hugeint_t>(source, col, row);
	switch (source_type.InternalType()) {
	case duckdb::PhysicalType::INT16:
		result_string = duckdb::StringCastFromDecimal::Operation<int16_t>(UnsafeFetchFromPtr<int16_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT32:
		result_string = duckdb::StringCastFromDecimal::Operation<int32_t>(UnsafeFetchFromPtr<int32_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT64:
		result_string = duckdb::StringCastFromDecimal::Operation<int64_t>(UnsafeFetchFromPtr<int64_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT128:
		result_string = duckdb::StringCastFromDecimal::Operation<hugeint_t>(
		    UnsafeFetchFromPtr<hugeint_t>(source_address), width, scale, result_vec);
		break;
	default:
		throw duckdb::InternalException("Unimplemented internal type for decimal");
	}
	result.data = reinterpret_cast<char *>(duckdb_malloc(sizeof(char) * (result_string.GetSize() + 1)));
	memcpy(result.data, result_string.GetData(), result_string.GetSize());
	result.data[result_string.GetSize()] = '\0';
	result.size = result_string.GetSize();
	return true;
}